

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts5PoslistSafeAppend(Fts5Buffer *pBuf,i64 *piPrev,i64 iPos)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = *piPrev;
  if ((long)uVar1 <= iPos) {
    uVar3 = iPos & 0x7fffffff00000000;
    if (uVar3 == (uVar1 & 0x7fffffff00000000)) {
      iVar2 = pBuf->n;
      uVar3 = uVar1;
    }
    else {
      iVar2 = pBuf->n;
      pBuf->n = iVar2 + 1;
      pBuf->p[iVar2] = '\x01';
      iVar2 = sqlite3Fts5PutVarint(pBuf->p + pBuf->n,iPos >> 0x20);
      iVar2 = iVar2 + pBuf->n;
      pBuf->n = iVar2;
    }
    iVar2 = sqlite3Fts5PutVarint(pBuf->p + iVar2,(iPos - uVar3) + 2);
    pBuf->n = pBuf->n + iVar2;
    *piPrev = iPos;
  }
  return;
}

Assistant:

static void sqlite3Fts5PoslistSafeAppend(
  Fts5Buffer *pBuf,
  i64 *piPrev,
  i64 iPos
){
  if( iPos>=*piPrev ){
    static const i64 colmask = ((i64)(0x7FFFFFFF)) << 32;
    if( (iPos & colmask) != (*piPrev & colmask) ){
      pBuf->p[pBuf->n++] = 1;
      pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos>>32));
      *piPrev = (iPos & colmask);
    }
    pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos-*piPrev)+2);
    *piPrev = iPos;
  }
}